

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManCheckSupp_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  
  while( true ) {
    uVar1 = *(undefined8 *)pObj;
    uVar3 = (uint)uVar1;
    if ((uVar3 >> 0x1e & 1) != 0) {
      return 1;
    }
    if ((~uVar3 & 0x9fffffff) == 0) break;
    iVar2 = Gia_ManCheckSupp_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    if (iVar2 != 0) {
      return 1;
    }
    pObj = pObj + -(ulong)((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
  }
  return 0;
}

Assistant:

int Gia_ManCheckSupp_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 )
        return 1;
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Gia_ManCheckSupp_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    return Gia_ManCheckSupp_rec( p, Gia_ObjFanin1(pObj) );
}